

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O3

void __thiscall xmrig::HttpResponse::end(HttpResponse *this,char *data,size_t size)

{
  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  uint uVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  _Alloc_hider _Var5;
  char cVar6;
  bool bVar7;
  ostream *poVar8;
  char *pcVar9;
  size_t sVar10;
  _Rb_tree_node_base *p_Var11;
  HttpContext *this_01;
  void *pvVar12;
  void *__dest;
  const_iterator cVar13;
  mapped_type *pmVar14;
  ulong uVar15;
  char cVar16;
  pointer pcVar17;
  _Rb_tree_header *p_Var18;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  ulong local_1e0;
  key_type local_1d8;
  stringstream ss;
  ostream local_1a8 [16];
  _Alloc_hider local_198;
  char local_188 [80];
  ios_base local_138 [264];
  
  bVar7 = isAlive(this);
  if (bVar7) {
    if (size == 0 && data != (char *)0x0) {
      size = strlen(data);
    }
    if (size != 0) {
      local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Content-Length","");
      cVar16 = '\x01';
      if (9 < size) {
        uVar15 = size;
        cVar6 = '\x04';
        do {
          cVar16 = cVar6;
          if (uVar15 < 100) {
            cVar16 = cVar16 + -2;
            goto LAB_00154047;
          }
          if (uVar15 < 1000) {
            cVar16 = cVar16 + -1;
            goto LAB_00154047;
          }
          if (uVar15 < 10000) goto LAB_00154047;
          bVar7 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar6 = cVar16 + '\x04';
        } while (bVar7);
        cVar16 = cVar16 + '\x01';
      }
LAB_00154047:
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct((ulong)&__str,cVar16);
      std::__detail::__to_chars_10_impl<unsigned_long>
                (__str._M_dataplus._M_p,(uint)__str._M_string_length,size);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&ss,&local_200,&__str);
      std::
      _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
      ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
                ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
                  *)&this->m_headers,
                 (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&ss);
      if (local_198._M_p != local_188) {
        operator_delete(local_198._M_p);
      }
      if ((ostream *)_ss != local_1a8) {
        operator_delete(_ss);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
    }
    local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_200,"Connection","");
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"close","");
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&ss,&local_200,&__str);
    std::
    _Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>
              ((_Rb_tree<std::__cxx11::string_const,std::pair<std::__cxx11::string_const,std::__cxx11::string_const>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>,std::less<std::__cxx11::string_const>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string_const>>>
                *)&this->m_headers,
               (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&ss);
    if (local_198._M_p != local_188) {
      operator_delete(local_198._M_p);
    }
    if ((ostream *)_ss != local_1a8) {
      operator_delete(_ss);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p);
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"HTTP/1.1 ",9);
    poVar8 = (ostream *)std::ostream::operator<<(local_1a8,this->m_statusCode);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
    pcVar9 = http_status_str(this->m_statusCode);
    if (pcVar9 == (char *)0x0) {
      std::ios::clear((int)poVar8 + (int)*(undefined8 *)(*(long *)poVar8 + -0x18));
    }
    else {
      sVar10 = strlen(pcVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,pcVar9,sVar10);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r\n",2);
    for (p_Var11 = (this->m_headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var11 != &(this->m_headers)._M_t._M_impl.super__Rb_tree_header;
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11)) {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,*(char **)(p_Var11 + 1),(long)p_Var11[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,*(char **)(p_Var11 + 2),(long)p_Var11[2]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\r\n",2);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\r\n",2);
    this_01 = HttpContext::get(0x1542dd);
    pvVar12 = operator_new(0x108);
    *(void **)pvVar12 = pvVar12;
    *(HttpContext **)((long)pvVar12 + 0xe0) = this_01;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)((long)pvVar12 + 200) = *(undefined8 *)((long)pvVar12 + 0xf0);
    *(undefined8 *)((long)pvVar12 + 0xc0) = *(undefined8 *)((long)pvVar12 + 0xe8);
    if (data == (char *)0x0) {
      *(undefined8 *)((long)pvVar12 + 0xd0) = 0;
      *(undefined8 *)((long)pvVar12 + 0xd8) = 0;
      __dest = (void *)0x0;
    }
    else {
      *(size_t *)((long)pvVar12 + 0xd8) = size;
      __dest = operator_new__(size);
      *(void **)((long)pvVar12 + 0xd0) = __dest;
      memcpy(__dest,data,size);
    }
    if (399 < this->m_statusCode) {
      HttpContext::ip_abi_cxx11_(&local_200,this_01);
      _Var5._M_p = local_200._M_dataplus._M_p;
      pcVar9 = http_method_str((this_01->super_HttpData).method);
      pcVar2 = (this_01->super_HttpData).url._M_dataplus._M_p;
      uVar1 = this->m_statusCode;
      lVar3 = *(long *)((long)pvVar12 + 0xd8);
      lVar4 = *(long *)((long)pvVar12 + 200);
      __str._M_dataplus._M_p = (pointer)&__str.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"user-agent","");
      this_00 = &(this_01->super_HttpData).headers;
      local_1e0 = (ulong)uVar1;
      cVar13 = std::
               _Rb_tree<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::find(&this_00->_M_t,&__str);
      p_Var18 = &(this_01->super_HttpData).headers._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)cVar13._M_node == p_Var18) {
        pcVar17 = (pointer)0x0;
      }
      else {
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"user-agent","");
        pmVar14 = std::
                  map<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::at(this_00,&local_1d8);
        pcVar17 = (pmVar14->_M_dataplus)._M_p;
      }
      Log::print(ERR,
                 "\x1b[0;36m%s \x1b[0m\x1b[0m\x1b[1;35m%s\x1b[0m\x1b[1;37m %s \x1b[0m\x1b[1;%dm%d \x1b[0m\x1b[1;37m%zu \x1b[0m\x1b[1;30m\"%s\"\x1b[0m"
                 ,_Var5._M_p,pcVar9,pcVar2,0x1f,local_1e0,lVar3 + lVar4,pcVar17);
      if (((_Rb_tree_header *)cVar13._M_node != p_Var18) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2)) {
        operator_delete(local_1d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__str._M_dataplus._M_p != &__str.field_2) {
        operator_delete(__str._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      __dest = *(void **)((long)pvVar12 + 0xd0);
    }
    uv_write(pvVar12,this_01->m_tcp,(long)pvVar12 + 0xc0,2 - (uint)(__dest == (void *)0x0),
             WriteBaton::onWrite);
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    std::ios_base::~ios_base(local_138);
  }
  return;
}

Assistant:

void xmrig::HttpResponse::end(const char *data, size_t size)
{
    if (!isAlive()) {
        return;
    }

    if (data && !size) {
        size = strlen(data);
    }

    if (size) {
        setHeader("Content-Length", std::to_string(size));
    }

    setHeader("Connection", "close");

    std::stringstream ss;
    ss << "HTTP/1.1 " << statusCode() << " " << http_status_str(static_cast<http_status>(statusCode())) << kCRLF;

    for (auto &header : m_headers) {
        ss << header.first << ": " << header.second << kCRLF;
    }

    ss << kCRLF;

    HttpContext *ctx  = HttpContext::get(m_id);
    WriteBaton *baton = new WriteBaton(ss, data, size, ctx);

#   ifndef APP_DEBUG
    if (statusCode() >= 400)
#   endif
    {
        const bool err = statusCode() >= 400;

        Log::print(err ? Log::ERR : Log::INFO, CYAN("%s ") CLEAR MAGENTA_BOLD("%s") WHITE_BOLD(" %s ") CSI "1;%dm%d " CLEAR WHITE_BOLD("%zu ") BLACK_BOLD("\"%s\""),
                   ctx->ip().c_str(),
                   http_method_str(static_cast<http_method>(ctx->method)),
                   ctx->url.c_str(),
                   err ? 31 : 32,
                   statusCode(),
                   baton->size(),
                   ctx->headers.count(kUserAgent) ? ctx->headers.at(kUserAgent).c_str() : nullptr
                   );
    }

    uv_write(&baton->req, ctx->stream(), baton->bufs, baton->count(), WriteBaton::onWrite);
}